

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O1

long CVariableInt::Compress(void *pSrc_,int SrcSize,void *pDst_,int DstSize)

{
  uchar *pDst;
  long lVar1;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/compression.cpp"
                 ,0x54,(uint)((SrcSize & 3U) == 0),"invalid bounds");
  pDst = (uchar *)pDst_;
  if (3 < (uint)SrcSize) {
    lVar1 = 0;
    do {
      if ((long)pDst_ + ((long)DstSize - (long)pDst) < 6) {
        return -1;
      }
      pDst = Pack(pDst,*(int *)((long)pSrc_ + lVar1 * 4));
      lVar1 = lVar1 + 1;
    } while (SrcSize >> 2 != (int)lVar1);
  }
  return (long)pDst - (long)pDst_;
}

Assistant:

long CVariableInt::Compress(const void *pSrc_, int SrcSize, void *pDst_, int DstSize)
{
	dbg_assert(SrcSize % sizeof(int) == 0, "invalid bounds");

	const int *pSrc = (int *)pSrc_;
	unsigned char *pDst = (unsigned char *)pDst_;
	const unsigned char *pDstEnd = pDst + DstSize;
	SrcSize /= sizeof(int);
	while(SrcSize)
	{
		if(pDstEnd - pDst <= MAX_BYTES_PACKED)
			return -1;
		pDst = CVariableInt::Pack(pDst, *pSrc);
		SrcSize--;
		pSrc++;
	}
	return (long)(pDst - (unsigned char *)pDst_);
}